

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

void send_recv_start(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  iVar1 = uv_is_readable((uv_stream_t *)&ctx2.channel);
  if (iVar1 == 1) {
    iVar1 = uv_is_writable((uv_stream_t *)&ctx2.channel);
    if (iVar1 == 1) {
      iVar1 = uv_is_closing((uv_handle_t *)&ctx2.channel);
      if (iVar1 == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&ctx2.channel,alloc_cb,read_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0x165;
      }
      else {
        pcVar3 = "0 == uv_is_closing((uv_handle_t*)&ctx2.channel)";
        uVar2 = 0x162;
      }
    }
    else {
      pcVar3 = "1 == uv_is_writable((uv_stream_t*)&ctx2.channel)";
      uVar2 = 0x161;
    }
  }
  else {
    pcVar3 = "1 == uv_is_readable((uv_stream_t*)&ctx2.channel)";
    uVar2 = 0x160;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT(1 == uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT(r == 0);
}